

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O2

void __thiscall
TStokesAnalytic::Force(TStokesAnalytic *this,TPZVec<double> *x,TPZVec<double> *force)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  long lVar4;
  int f;
  long lVar5;
  int e;
  TPZManVector<double,_3> xst;
  TPZManVector<double,_3> beta;
  TPZManVector<double,_3> locforce;
  double local_130;
  TPZManVector<double,_3> gradU_beta;
  TPZFMatrix<double> grad;
  TPZManVector<double,_3> gradUt_beta;
  
  grad.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&locforce,3,(double *)&grad);
  grad.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&beta,3,(double *)&grad);
  grad.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&gradU_beta,3,(double *)&grad);
  grad.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&gradUt_beta,3,(double *)&grad);
  TPZManVector<double,_3>::TPZManVector(&xst,3);
  local_130 = 0.0;
  TPZFMatrix<double>::TPZFMatrix(&grad,3,3,&local_130);
  pdVar3 = x->fStore;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    xst.super_TPZVec<double>.fStore[lVar4] = pdVar3[lVar4];
  }
  DivSigma<double>(this,x,&locforce.super_TPZVec<double>);
  switch(this->fProblemType) {
  case EStokes:
    pdVar3 = force->fStore;
    *pdVar3 = -*locforce.super_TPZVec<double>.fStore;
    pdVar3[1] = -locforce.super_TPZVec<double>.fStore[1];
    pdVar3[2] = -locforce.super_TPZVec<double>.fStore[2];
    break;
  case ENavierStokes:
  case EOseen:
    graduxy<double>(this,&xst.super_TPZVec<double>,&grad);
    uxy<double>(this,&xst.super_TPZVec<double>,&beta.super_TPZVec<double>);
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        pdVar3 = TPZFMatrix<double>::operator()(&grad,lVar4,lVar5);
        gradU_beta.super_TPZVec<double>.fStore[lVar4] =
             *pdVar3 * beta.super_TPZVec<double>.fStore[lVar5] +
             gradU_beta.super_TPZVec<double>.fStore[lVar4];
      }
    }
    pdVar3 = force->fStore;
    *pdVar3 = *gradU_beta.super_TPZVec<double>.fStore - *locforce.super_TPZVec<double>.fStore;
    pdVar3[1] = gradU_beta.super_TPZVec<double>.fStore[1] - locforce.super_TPZVec<double>.fStore[1];
    pdVar3[2] = gradU_beta.super_TPZVec<double>.fStore[2] - locforce.super_TPZVec<double>.fStore[2];
    break;
  case ENavierStokesCDG:
  case EOseenCDG:
    graduxy<double>(this,&xst.super_TPZVec<double>,&grad);
    uxy<double>(this,&xst.super_TPZVec<double>,&beta.super_TPZVec<double>);
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        pdVar3 = TPZFMatrix<double>::operator()(&grad,lVar4,lVar5);
        gradU_beta.super_TPZVec<double>.fStore[lVar4] =
             *pdVar3 * beta.super_TPZVec<double>.fStore[lVar5] +
             gradU_beta.super_TPZVec<double>.fStore[lVar4];
      }
    }
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        pdVar3 = TPZFMatrix<double>::operator()(&grad,lVar5,lVar4);
        gradUt_beta.super_TPZVec<double>.fStore[lVar4] =
             *pdVar3 * beta.super_TPZVec<double>.fStore[lVar5] +
             gradUt_beta.super_TPZVec<double>.fStore[lVar4];
      }
    }
    pdVar3 = force->fStore;
    *pdVar3 = (*gradU_beta.super_TPZVec<double>.fStore - *locforce.super_TPZVec<double>.fStore) -
              *gradUt_beta.super_TPZVec<double>.fStore;
    pdVar3[1] = (gradU_beta.super_TPZVec<double>.fStore[1] - locforce.super_TPZVec<double>.fStore[1]
                ) - gradUt_beta.super_TPZVec<double>.fStore[1];
    pdVar3[2] = (gradU_beta.super_TPZVec<double>.fStore[2] - locforce.super_TPZVec<double>.fStore[2]
                ) - gradUt_beta.super_TPZVec<double>.fStore[2];
    break;
  case EBrinkman:
    uxy<double>(this,&xst.super_TPZVec<double>,&beta.super_TPZVec<double>);
    pdVar3 = force->fStore;
    *pdVar3 = this->fcBrinkman * *beta.super_TPZVec<double>.fStore -
              *locforce.super_TPZVec<double>.fStore;
    pdVar3[1] = this->fcBrinkman * beta.super_TPZVec<double>.fStore[1] -
                locforce.super_TPZVec<double>.fStore[1];
    pdVar3[2] = this->fcBrinkman * beta.super_TPZVec<double>.fStore[2] -
                locforce.super_TPZVec<double>.fStore[2];
    graduxy<double>(this,&xst.super_TPZVec<double>,&grad);
    pdVar3 = TPZFMatrix<double>::operator()(&grad,0,0);
    dVar1 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(&grad,1,1);
    dVar2 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(&grad,2,2);
    force->fStore[3] = dVar1 + dVar2 + *pdVar3;
    break;
  default:
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZAnalyticSolution.cpp"
               ,0xa57);
  }
  TPZFMatrix<double>::~TPZFMatrix(&grad);
  TPZManVector<double,_3>::~TPZManVector(&xst);
  TPZManVector<double,_3>::~TPZManVector(&gradUt_beta);
  TPZManVector<double,_3>::~TPZManVector(&gradU_beta);
  TPZManVector<double,_3>::~TPZManVector(&beta);
  TPZManVector<double,_3>::~TPZManVector(&locforce);
  return;
}

Assistant:

void TStokesAnalytic::Force(const TPZVec<REAL> &x, TPZVec<STATE> &force) const
{

    TPZManVector<STATE,3> locforce(3,0.),beta(3,0.),gradU_beta(3,0.),gradUt_beta(3,0.),xst(3);
    TPZFMatrix<STATE> grad(3,3,0.);
    for(int i=0; i<3; i++) xst[i] = x[i];
    DivSigma(x, locforce);

    switch(fProblemType)
    {
        case EStokes:
            force[0] = -locforce[0];
            force[1] = -locforce[1];
            force[2] = -locforce[2];
            break;

        case EBrinkman:
    	    uxy(xst,beta);
            force[0] = -locforce[0]+fcBrinkman*beta[0];
            force[1] = -locforce[1]+fcBrinkman*beta[1];
            force[2] = -locforce[2]+fcBrinkman*beta[2];
	    graduxy(xst,grad);
            force[3] = grad(0,0)+grad(1,1)+grad(2,2); //Pressure block term
            break;
            
        case ENavierStokes:
        case EOseen:

            graduxy(xst,grad);
            uxy(xst,beta);
            
            for (int e=0; e<3; e++) {
                for (int f=0; f<3; f++) {
                    gradU_beta[e] += grad(e,f)*beta[f];
                }
            }
            
            force[0] = -locforce[0]+gradU_beta[0];
            force[1] = -locforce[1]+gradU_beta[1];
            force[2] = -locforce[2]+gradU_beta[2];
            break;

        case ENavierStokesCDG:
        case EOseenCDG:

            graduxy(xst,grad);
            uxy(xst,beta);

            for (int e=0; e<3; e++) {
                for (int f=0; f<3; f++) {
                    gradU_beta[e] += grad(e,f)*beta[f];
                }
            }

            for (int e=0; e<3; e++) {
                for (int f=0; f<3; f++) {
                    gradUt_beta[e] += grad(f,e)*beta[f];
                }
            }

            force[0] = -locforce[0]+gradU_beta[0]-gradUt_beta[0];
            force[1] = -locforce[1]+gradU_beta[1]-gradUt_beta[1];
            force[2] = -locforce[2]+gradU_beta[2]-gradUt_beta[2];
            break;
            
        default:
            DebugStop();
    }



}